

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O2

void duckdb::BitwiseANDOperation(DataChunk *args,ExpressionState *state,Vector *result)

{
  value_type vVar1;
  value_type vVar2;
  anon_union_16_2_67f50693_for_value *paVar3;
  long lVar4;
  long lVar5;
  reference vector;
  reference vector_00;
  UnifiedVectorFormat *pUVar6;
  UnifiedVectorFormat *pUVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  VectorType VVar13;
  ValidityMask *in_R9;
  undefined8 *puVar14;
  UnifiedVectorFormat *pUVar15;
  ulong uVar16;
  bool bVar17;
  string_t left;
  string_t left_00;
  string_t left_01;
  string_t left_02;
  string_t left_03;
  string_t left_04;
  string_t left_05;
  anon_struct_16_3_d7536bce_for_pointer aVar18;
  string_t sVar19;
  string_t right;
  string_t right_00;
  string_t right_01;
  string_t right_02;
  string_t right_03;
  string_t right_04;
  string_t right_05;
  string_t right_06;
  idx_t in_stack_ffffffffffffff08;
  UnifiedVectorFormat *local_d8;
  long *local_c0;
  long local_b8;
  long local_b0;
  UnifiedVectorFormat ldata;
  long local_70;
  long local_68;
  
  vector = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  vector_00 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,1);
  vVar1 = *vector;
  vVar2 = *vector_00;
  VVar13 = (VectorType)result;
  if (((byte)vVar1 ^ 2) == 0 && ((byte)vVar2 ^ 2) == 0) {
    duckdb::Vector::SetVectorType(VVar13);
    paVar3 = *(anon_union_16_2_67f50693_for_value **)(result + 0x20);
    if (((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) &&
       ((*(byte **)(vector_00 + 0x28) == (byte *)0x0 || ((**(byte **)(vector_00 + 0x28) & 1) != 0)))
       ) {
      aVar18 = (anon_struct_16_3_d7536bce_for_pointer)
               BinaryLambdaWrapper::
               Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                         ((anon_class_8_1_6971b95b)result,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector + 0x20))->pointer,
                          (string_t)
                          (*(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20))->pointer,
                          in_R9,in_stack_ffffffffffffff08);
      paVar3->pointer = aVar18;
      return;
    }
  }
  else {
    local_d8 = *(UnifiedVectorFormat **)(args + 0x18);
    if (((byte)vVar2 ^ 2) == 0 && vVar1 == (value_type)0x0) {
      lVar4 = *(long *)(vector + 0x20);
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector_00 + 0x20);
      if ((*(byte **)(vector_00 + 0x28) == (byte *)0x0) ||
         ((**(byte **)(vector_00 + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar13);
        lVar5 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector);
        FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          lVar11 = 8;
          while (bVar17 = local_d8 != (UnifiedVectorFormat *)0x0, local_d8 = local_d8 + -1, bVar17)
          {
            left_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar11);
            left_02.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar11);
            sVar19 = BinaryLambdaWrapper::
                     Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,left_02,(string_t)paVar3->pointer,
                                in_R9,in_stack_ffffffffffffff08);
            *(long *)(lVar5 + -8 + lVar11) = sVar19.value._0_8_;
            *(long *)(lVar5 + lVar11) = sVar19.value._8_8_;
            lVar11 = lVar11 + 0x10;
          }
          return;
        }
        uVar8 = 0;
        pUVar15 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(local_d8 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar15 + 0x40;
            if (local_d8 <= pUVar15 + 0x40) {
              pUVar6 = local_d8;
            }
LAB_00774516:
            uVar9 = (long)pUVar15 << 4 | 8;
            for (; pUVar7 = pUVar15, pUVar15 < pUVar6; pUVar15 = pUVar15 + 1) {
              left.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
              left.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
              sVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left,(string_t)paVar3->pointer,
                                  in_R9,uVar8);
              *(long *)(lVar5 + -8 + uVar9) = sVar19.value._0_8_;
              *(long *)(lVar5 + uVar9) = sVar19.value._8_8_;
              uVar9 = uVar9 + 0x10;
            }
          }
          else {
            uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar15 + 0x40;
            if (local_d8 <= pUVar15 + 0x40) {
              pUVar6 = local_d8;
            }
            if (uVar9 == 0xffffffffffffffff) goto LAB_00774516;
            pUVar7 = pUVar6;
            if (uVar9 != 0) {
              uVar10 = (long)pUVar15 << 4 | 8;
              for (uVar16 = 0; pUVar7 = pUVar15 + uVar16, pUVar15 + uVar16 < pUVar6;
                  uVar16 = uVar16 + 1) {
                if ((uVar9 >> (uVar16 & 0x3f) & 1) != 0) {
                  left_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar10);
                  left_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar10);
                  sVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_00,
                                      (string_t)paVar3->pointer,in_R9,uVar8);
                  *(long *)(lVar5 + -8 + uVar10) = sVar19.value._0_8_;
                  *(long *)(lVar5 + uVar10) = sVar19.value._8_8_;
                }
                uVar10 = uVar10 + 0x10;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar15 = pUVar7;
        } while( true );
      }
    }
    else {
      if (((byte)vVar1 ^ 2) != 0 || vVar2 != (value_type)0x0) {
        if (vVar2 == (value_type)0x0 && vVar1 == (value_type)0x0) {
          lVar4 = *(long *)(vector + 0x20);
          lVar5 = *(long *)(vector_00 + 0x20);
          duckdb::Vector::SetVectorType(VVar13);
          lVar11 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          FlatVector::VerifyFlatVector(vector);
          FlatVector::SetValidity(result,(ValidityMask *)(vector + 0x28));
          FlatVector::VerifyFlatVector(vector_00);
          duckdb::ValidityMask::Combine((ValidityMask *)(result + 0x28),(ulong)(vector_00 + 0x28));
          if (*(long *)(result + 0x28) == 0) {
            lVar12 = 8;
            while (bVar17 = local_d8 != (UnifiedVectorFormat *)0x0, local_d8 = local_d8 + -1, bVar17
                  ) {
              sVar19.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar12);
              sVar19.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar12);
              right_06.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + lVar12);
              right_06.value._0_8_ = *(undefined8 *)(lVar5 + -8 + lVar12);
              sVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,sVar19,right_06,in_R9,
                                  in_stack_ffffffffffffff08);
              *(long *)(lVar11 + -8 + lVar12) = sVar19.value._0_8_;
              *(long *)(lVar11 + lVar12) = sVar19.value._8_8_;
              lVar12 = lVar12 + 0x10;
            }
          }
          else {
            pUVar15 = (UnifiedVectorFormat *)0x0;
            for (uVar8 = 0; uVar8 != (ulong)(local_d8 + 0x3f) >> 6; uVar8 = uVar8 + 1) {
              lVar12 = *(long *)(result + 0x28);
              if (lVar12 == 0) {
                pUVar6 = pUVar15 + 0x40;
                if (local_d8 <= pUVar15 + 0x40) {
                  pUVar6 = local_d8;
                }
LAB_007749a5:
                uVar9 = (long)pUVar15 << 4 | 8;
                for (; pUVar7 = pUVar15, pUVar15 < pUVar6; pUVar15 = pUVar15 + 1) {
                  left_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
                  left_03.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
                  right_02.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar9);
                  right_02.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar9);
                  sVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,left_03,right_02,in_R9,uVar8);
                  *(long *)(lVar11 + -8 + uVar9) = sVar19.value._0_8_;
                  *(long *)(lVar11 + uVar9) = sVar19.value._8_8_;
                  uVar9 = uVar9 + 0x10;
                }
              }
              else {
                uVar9 = *(ulong *)(lVar12 + uVar8 * 8);
                pUVar6 = pUVar15 + 0x40;
                if (local_d8 <= pUVar15 + 0x40) {
                  pUVar6 = local_d8;
                }
                if (uVar9 == 0xffffffffffffffff) goto LAB_007749a5;
                pUVar7 = pUVar6;
                if (uVar9 != 0) {
                  uVar16 = (long)pUVar15 << 4 | 8;
                  for (uVar10 = 0; pUVar7 = pUVar15 + uVar10, pUVar15 + uVar10 < pUVar6;
                      uVar10 = uVar10 + 1) {
                    if ((uVar9 >> (uVar10 & 0x3f) & 1) != 0) {
                      left_04.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar16);
                      left_04.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar16);
                      right_03.value.pointer.ptr = (char *)*(undefined8 *)(lVar5 + uVar16);
                      right_03.value._0_8_ = *(undefined8 *)(lVar5 + -8 + uVar16);
                      sVar19 = BinaryLambdaWrapper::
                               Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                         ((anon_class_8_1_6971b95b)result,left_04,right_03,in_R9,
                                          uVar8);
                      *(long *)(lVar11 + -8 + uVar16) = sVar19.value._0_8_;
                      *(long *)(lVar11 + uVar16) = sVar19.value._8_8_;
                    }
                    uVar16 = uVar16 + 0x10;
                  }
                }
              }
              pUVar15 = pUVar7;
            }
          }
        }
        else {
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&ldata);
          duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          duckdb::Vector::ToUnifiedFormat((ulong)vector,local_d8);
          duckdb::Vector::ToUnifiedFormat((ulong)vector_00,local_d8);
          duckdb::Vector::SetVectorType(VVar13);
          lVar4 = *(long *)(result + 0x20);
          FlatVector::VerifyFlatVector(result);
          if (local_b0 == 0 && local_68 == 0) {
            puVar14 = (undefined8 *)(lVar4 + 8);
            for (pUVar15 = (UnifiedVectorFormat *)0x0; local_d8 != pUVar15; pUVar15 = pUVar15 + 1) {
              pUVar6 = pUVar15;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar15 * 4);
              }
              pUVar7 = pUVar15;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar15 * 4);
              }
              left_01.value.pointer.ptr =
                   (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
              left_01.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
              right.value.pointer.ptr = (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar7 * 0x10);
              right.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar7 * 0x10);
              sVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,left_01,right,in_R9,
                                  in_stack_ffffffffffffff08);
              puVar14[-1] = sVar19.value._0_8_;
              *puVar14 = sVar19.value._8_8_;
              puVar14 = puVar14 + 2;
            }
          }
          else {
            puVar14 = (undefined8 *)(lVar4 + 8);
            for (pUVar15 = (UnifiedVectorFormat *)0x0; local_d8 != pUVar15; pUVar15 = pUVar15 + 1) {
              pUVar6 = pUVar15;
              if (*_ldata != 0) {
                pUVar6 = (UnifiedVectorFormat *)(ulong)*(uint *)(*_ldata + (long)pUVar15 * 4);
              }
              pUVar7 = pUVar15;
              if (*local_c0 != 0) {
                pUVar7 = (UnifiedVectorFormat *)(ulong)*(uint *)(*local_c0 + (long)pUVar15 * 4);
              }
              if (((local_68 == 0) ||
                  ((*(ulong *)(local_68 + ((ulong)pUVar6 >> 6) * 8) >> ((ulong)pUVar6 & 0x3f) & 1)
                   != 0)) &&
                 ((local_b0 == 0 ||
                  ((*(ulong *)(local_b0 + ((ulong)pUVar7 >> 6) * 8) >> ((ulong)pUVar7 & 0x3f) & 1)
                   != 0)))) {
                left_05.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_70 + 8 + (long)pUVar6 * 0x10);
                left_05.value._0_8_ = *(undefined8 *)(local_70 + (long)pUVar6 * 0x10);
                right_04.value.pointer.ptr =
                     (char *)*(undefined8 *)(local_b8 + 8 + (long)pUVar7 * 0x10);
                right_04.value._0_8_ = *(undefined8 *)(local_b8 + (long)pUVar7 * 0x10);
                sVar19 = BinaryLambdaWrapper::
                         Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                   ((anon_class_8_1_6971b95b)result,left_05,right_04,in_R9,
                                    in_stack_ffffffffffffff08);
                puVar14[-1] = sVar19.value._0_8_;
                *puVar14 = sVar19.value._8_8_;
              }
              else {
                TemplatedValidityMask<unsigned_long>::SetInvalid
                          ((TemplatedValidityMask<unsigned_long> *)(result + 0x28),(idx_t)pUVar15);
              }
              puVar14 = puVar14 + 2;
            }
          }
          UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)&local_c0);
          UnifiedVectorFormat::~UnifiedVectorFormat(&ldata);
        }
        return;
      }
      paVar3 = *(anon_union_16_2_67f50693_for_value **)(vector + 0x20);
      lVar4 = *(long *)(vector_00 + 0x20);
      if ((*(byte **)(vector + 0x28) == (byte *)0x0) || ((**(byte **)(vector + 0x28) & 1) != 0)) {
        duckdb::Vector::SetVectorType(VVar13);
        lVar5 = *(long *)(result + 0x20);
        FlatVector::VerifyFlatVector(result);
        FlatVector::VerifyFlatVector(vector_00);
        FlatVector::SetValidity(result,(ValidityMask *)(vector_00 + 0x28));
        if (*(long *)(result + 0x28) == 0) {
          lVar11 = 8;
          while (bVar17 = local_d8 != (UnifiedVectorFormat *)0x0, local_d8 = local_d8 + -1, bVar17)
          {
            right_05.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + lVar11);
            right_05.value._0_8_ = *(undefined8 *)(lVar4 + -8 + lVar11);
            sVar19 = BinaryLambdaWrapper::
                     Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                               ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,right_05,
                                in_R9,in_stack_ffffffffffffff08);
            *(long *)(lVar5 + -8 + lVar11) = sVar19.value._0_8_;
            *(long *)(lVar5 + lVar11) = sVar19.value._8_8_;
            lVar11 = lVar11 + 0x10;
          }
          return;
        }
        uVar8 = 0;
        pUVar15 = (UnifiedVectorFormat *)0x0;
        do {
          if (uVar8 == (ulong)(local_d8 + 0x3f) >> 6) {
            return;
          }
          if (*(long *)(result + 0x28) == 0) {
            pUVar6 = pUVar15 + 0x40;
            if (local_d8 <= pUVar15 + 0x40) {
              pUVar6 = local_d8;
            }
LAB_007747c8:
            uVar9 = (long)pUVar15 << 4 | 8;
            for (; pUVar7 = pUVar15, pUVar15 < pUVar6; pUVar15 = pUVar15 + 1) {
              right_00.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar9);
              right_00.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar9);
              sVar19 = BinaryLambdaWrapper::
                       Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                 ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,right_00
                                  ,in_R9,uVar8);
              *(long *)(lVar5 + -8 + uVar9) = sVar19.value._0_8_;
              *(long *)(lVar5 + uVar9) = sVar19.value._8_8_;
              uVar9 = uVar9 + 0x10;
            }
          }
          else {
            uVar9 = *(ulong *)(*(long *)(result + 0x28) + uVar8 * 8);
            pUVar6 = pUVar15 + 0x40;
            if (local_d8 <= pUVar15 + 0x40) {
              pUVar6 = local_d8;
            }
            if (uVar9 == 0xffffffffffffffff) goto LAB_007747c8;
            pUVar7 = pUVar6;
            if (uVar9 != 0) {
              uVar10 = (long)pUVar15 << 4 | 8;
              for (uVar16 = 0; pUVar7 = pUVar15 + uVar16, pUVar15 + uVar16 < pUVar6;
                  uVar16 = uVar16 + 1) {
                if ((uVar9 >> (uVar16 & 0x3f) & 1) != 0) {
                  right_01.value.pointer.ptr = (char *)*(undefined8 *)(lVar4 + uVar10);
                  right_01.value._0_8_ = *(undefined8 *)(lVar4 + -8 + uVar10);
                  sVar19 = BinaryLambdaWrapper::
                           Operation<duckdb::BitwiseANDOperation(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                                     ((anon_class_8_1_6971b95b)result,(string_t)paVar3->pointer,
                                      right_01,in_R9,uVar8);
                  *(long *)(lVar5 + -8 + uVar10) = sVar19.value._0_8_;
                  *(long *)(lVar5 + uVar10) = sVar19.value._8_8_;
                }
                uVar10 = uVar10 + 0x10;
              }
            }
          }
          uVar8 = uVar8 + 1;
          pUVar15 = pUVar7;
        } while( true );
      }
    }
    duckdb::Vector::SetVectorType(VVar13);
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void BitwiseANDOperation(DataChunk &args, ExpressionState &state, Vector &result) {
	BinaryExecutor::Execute<string_t, string_t, string_t>(
	    args.data[0], args.data[1], result, args.size(), [&](string_t rhs, string_t lhs) {
		    string_t target = StringVector::EmptyString(result, rhs.GetSize());

		    Bit::BitwiseAnd(rhs, lhs, target);
		    return target;
	    });
}